

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dequantize_x86.cpp
# Opt level: O0

void ncnn::dequantize(int *intptr,float *ptr,Mat *scale_data,Mat *bias_data,int elemcount,
                     int elempack)

{
  float fVar1;
  float fVar2;
  undefined1 (*pauVar3) [32];
  undefined1 (*pauVar4) [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [24];
  int iVar13;
  long *in_RCX;
  long *in_RDX;
  float *in_RSI;
  undefined1 (*in_RDI) [64];
  int in_R8D;
  int in_R9D;
  undefined1 auVar14 [64];
  __m128 _v_5;
  __m256 _v_4;
  __m512 _v_3;
  int i_1;
  __m512 _bias_avx512;
  __m256 _bias_avx;
  __m128 _bias;
  float bias;
  __m128 _v_2;
  __m256 _v_1;
  __m512 _v;
  int i;
  __m512 _scale_avx512;
  __m256 _scale_avx;
  __m128 _scale;
  float scale;
  int size;
  int bias_data_size;
  int scale_data_size;
  undefined8 local_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 uStack_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  int local_bc4;
  undefined1 local_bc0 [64];
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b50;
  undefined8 uStack_b48;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 uStack_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  int local_a84;
  undefined1 local_a80 [64];
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  float *local_9b0;
  undefined1 (*local_9a8) [64];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined4 uStack_404;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float local_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  
  iVar13 = in_R8D * in_R9D;
  fVar1 = *(float *)*in_RDX;
  local_9f0 = CONCAT44(fVar1,fVar1);
  uStack_9e8 = CONCAT44(fVar1,fVar1);
  auVar6 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
  auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)fVar1),0x20);
  auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)fVar1),0x30);
  auVar7 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
  auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)fVar1),0x20);
  auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)fVar1),0x30);
  local_200 = auVar6._0_8_;
  uStack_1f8 = auVar6._8_8_;
  uStack_1f0 = auVar7._0_8_;
  uStack_1e8 = auVar7._8_8_;
  local_a20 = local_200;
  uStack_a18 = uStack_1f8;
  uStack_a10 = uStack_1f0;
  uStack_a08 = uStack_1e8;
  local_a80 = vbroadcastss_avx512f(ZEXT416((uint)fVar1));
  if (1 < *(int *)((long)in_RDX + 0x2c)) {
    if (in_R9D == 0x10) {
      local_a80 = *(undefined1 (*) [64])*in_RDX;
    }
    if (in_R9D == 8) {
      pauVar3 = (undefined1 (*) [32])*in_RDX;
      local_a20 = *(undefined8 *)*pauVar3;
      uStack_a18 = *(undefined8 *)(*pauVar3 + 8);
      uStack_a10 = *(undefined8 *)(*pauVar3 + 0x10);
      uStack_a08 = *(undefined8 *)(*pauVar3 + 0x18);
      local_a80 = vinsertf64x4_avx512f(ZEXT3264(*pauVar3),*pauVar3,1);
    }
    if (in_R9D == 4) {
      pauVar4 = (undefined1 (*) [16])*in_RDX;
      local_a20 = *(undefined8 *)*pauVar4;
      uStack_a18 = *(undefined8 *)(*pauVar4 + 8);
      auVar5._16_8_ = local_a20;
      auVar5._0_16_ = *pauVar4;
      auVar5._24_8_ = uStack_a18;
      local_a80 = vinsertf64x4_avx512f
                            (ZEXT3264(CONCAT824(uStack_a18,CONCAT816(local_a20,*pauVar4))),auVar5,1)
      ;
      uStack_a10 = local_a20;
      uStack_a08 = uStack_a18;
      local_9f0 = local_a20;
      uStack_9e8 = uStack_a18;
    }
  }
  local_9b0 = in_RSI;
  local_9a8 = in_RDI;
  if (*(int *)((long)in_RCX + 0x2c) == 0) {
    for (local_a84 = 0; local_a84 + 0xf < iVar13; local_a84 = local_a84 + 0x10) {
      auVar14 = vmovdqu64_avx512f(*local_9a8);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar14 = vcvtdq2ps_avx512f(auVar14);
      auVar14 = vmulps_avx512f(auVar14,local_a80);
      local_b00 = auVar14._0_8_;
      uStack_af8 = auVar14._8_8_;
      uStack_af0 = auVar14._16_8_;
      uStack_ae8 = auVar14._24_8_;
      uStack_ae0 = auVar14._32_8_;
      uStack_ad8 = auVar14._40_8_;
      uStack_ad0 = auVar14._48_8_;
      uStack_ac8 = auVar14._56_8_;
      *(undefined8 *)local_9b0 = local_b00;
      *(undefined8 *)(local_9b0 + 2) = uStack_af8;
      *(undefined8 *)(local_9b0 + 4) = uStack_af0;
      *(undefined8 *)(local_9b0 + 6) = uStack_ae8;
      *(undefined8 *)(local_9b0 + 8) = uStack_ae0;
      *(undefined8 *)(local_9b0 + 10) = uStack_ad8;
      *(undefined8 *)(local_9b0 + 0xc) = uStack_ad0;
      *(undefined8 *)(local_9b0 + 0xe) = uStack_ac8;
      local_9a8 = local_9a8 + 1;
      local_9b0 = local_9b0 + 0x10;
    }
    for (; local_a84 + 7 < iVar13; local_a84 = local_a84 + 8) {
      auVar5 = vcvtdq2ps_avx(*(undefined1 (*) [32])*local_9a8);
      local_420 = auVar5._0_4_;
      fStack_41c = auVar5._4_4_;
      fStack_418 = auVar5._8_4_;
      fStack_414 = auVar5._12_4_;
      fStack_410 = auVar5._16_4_;
      fStack_40c = auVar5._20_4_;
      fStack_408 = auVar5._24_4_;
      uStack_404 = auVar5._28_4_;
      local_440 = (float)local_a20;
      fStack_43c = (float)((ulong)local_a20 >> 0x20);
      fStack_438 = (float)uStack_a18;
      fStack_434 = (float)((ulong)uStack_a18 >> 0x20);
      fStack_430 = (float)uStack_a10;
      fStack_42c = (float)((ulong)uStack_a10 >> 0x20);
      fStack_428 = (float)uStack_a08;
      local_b20 = CONCAT44(fStack_41c * fStack_43c,local_420 * local_440);
      uStack_b18._0_4_ = fStack_418 * fStack_438;
      uStack_b18._4_4_ = fStack_414 * fStack_434;
      uStack_b10._0_4_ = fStack_410 * fStack_430;
      uStack_b10._4_4_ = fStack_40c * fStack_42c;
      auVar12 = _local_b20;
      uStack_b08._0_4_ = fStack_408 * fStack_428;
      uStack_b08._4_4_ = uStack_404;
      auVar5 = _local_b20;
      uStack_b10 = auVar12._16_8_;
      uStack_b08 = auVar5._24_8_;
      *(undefined8 *)local_9b0 = local_b20;
      *(undefined8 *)(local_9b0 + 2) = uStack_b18;
      *(undefined8 *)(local_9b0 + 4) = uStack_b10;
      *(undefined8 *)(local_9b0 + 6) = uStack_b08;
      local_9a8 = (undefined1 (*) [64])(*local_9a8 + 0x20);
      local_9b0 = local_9b0 + 8;
    }
    for (; local_a84 + 3 < iVar13; local_a84 = local_a84 + 4) {
      auVar6 = vcvtdq2ps_avx(*(undefined1 (*) [16])*local_9a8);
      local_350 = auVar6._0_4_;
      fStack_34c = auVar6._4_4_;
      fStack_348 = auVar6._8_4_;
      fStack_344 = auVar6._12_4_;
      local_360 = (float)local_9f0;
      fStack_35c = (float)((ulong)local_9f0 >> 0x20);
      fStack_358 = (float)uStack_9e8;
      fStack_354 = (float)((ulong)uStack_9e8 >> 0x20);
      local_b30 = CONCAT44(fStack_34c * fStack_35c,local_350 * local_360);
      uStack_b28._0_4_ = fStack_348 * fStack_358;
      uStack_b28._4_4_ = fStack_344 * fStack_354;
      *(undefined8 *)local_9b0 = local_b30;
      *(undefined8 *)(local_9b0 + 2) = uStack_b28;
      local_9a8 = (undefined1 (*) [64])(*local_9a8 + 0x10);
      local_9b0 = local_9b0 + 4;
    }
    for (; local_a84 < iVar13; local_a84 = local_a84 + 1) {
      *local_9b0 = (float)*(int *)*local_9a8 * fVar1;
      local_9a8 = (undefined1 (*) [64])(*local_9a8 + 4);
      local_9b0 = local_9b0 + 1;
    }
  }
  else {
    fVar2 = *(float *)*in_RCX;
    local_b50 = CONCAT44(fVar2,fVar2);
    uStack_b48 = CONCAT44(fVar2,fVar2);
    auVar6 = vinsertps_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),0x10);
    auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)fVar2),0x20);
    auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)fVar2),0x30);
    auVar7 = vinsertps_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),0x10);
    auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)fVar2),0x20);
    auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)fVar2),0x30);
    local_1c0 = auVar6._0_8_;
    uStack_1b8 = auVar6._8_8_;
    uStack_1b0 = auVar7._0_8_;
    uStack_1a8 = auVar7._8_8_;
    local_b80 = local_1c0;
    uStack_b78 = uStack_1b8;
    uStack_b70 = uStack_1b0;
    uStack_b68 = uStack_1a8;
    local_bc0 = vbroadcastss_avx512f(ZEXT416((uint)fVar2));
    if (1 < *(int *)((long)in_RCX + 0x2c)) {
      if (in_R9D == 0x10) {
        local_bc0 = *(undefined1 (*) [64])*in_RCX;
      }
      if (in_R9D == 8) {
        pauVar3 = (undefined1 (*) [32])*in_RCX;
        local_b80 = *(undefined8 *)*pauVar3;
        uStack_b78 = *(undefined8 *)(*pauVar3 + 8);
        uStack_b70 = *(undefined8 *)(*pauVar3 + 0x10);
        uStack_b68 = *(undefined8 *)(*pauVar3 + 0x18);
        local_bc0 = vinsertf64x4_avx512f(ZEXT3264(*pauVar3),*pauVar3,1);
      }
      if (in_R9D == 4) {
        pauVar4 = (undefined1 (*) [16])*in_RCX;
        local_b80 = *(undefined8 *)*pauVar4;
        uStack_b78 = *(undefined8 *)(*pauVar4 + 8);
        auVar8._16_8_ = local_b80;
        auVar8._0_16_ = *pauVar4;
        auVar8._24_8_ = uStack_b78;
        local_bc0 = vinsertf64x4_avx512f
                              (ZEXT3264(CONCAT824(uStack_b78,CONCAT816(local_b80,*pauVar4))),auVar8,
                               1);
        uStack_b70 = local_b80;
        uStack_b68 = uStack_b78;
        local_b50 = local_b80;
        uStack_b48 = uStack_b78;
      }
    }
    for (local_bc4 = 0; local_bc4 + 0xf < iVar13; local_bc4 = local_bc4 + 0x10) {
      auVar14 = vmovdqu64_avx512f(*local_9a8);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar14 = vcvtdq2ps_avx512f(auVar14);
      auVar14 = vfmadd213ps_avx512f(local_a80,auVar14,local_bc0);
      local_c40 = auVar14._0_8_;
      uStack_c38 = auVar14._8_8_;
      uStack_c30 = auVar14._16_8_;
      uStack_c28 = auVar14._24_8_;
      uStack_c20 = auVar14._32_8_;
      uStack_c18 = auVar14._40_8_;
      uStack_c10 = auVar14._48_8_;
      uStack_c08 = auVar14._56_8_;
      *(undefined8 *)local_9b0 = local_c40;
      *(undefined8 *)(local_9b0 + 2) = uStack_c38;
      *(undefined8 *)(local_9b0 + 4) = uStack_c30;
      *(undefined8 *)(local_9b0 + 6) = uStack_c28;
      *(undefined8 *)(local_9b0 + 8) = uStack_c20;
      *(undefined8 *)(local_9b0 + 10) = uStack_c18;
      *(undefined8 *)(local_9b0 + 0xc) = uStack_c10;
      *(undefined8 *)(local_9b0 + 0xe) = uStack_c08;
      local_9a8 = local_9a8 + 1;
      local_9b0 = local_9b0 + 0x10;
    }
    for (; local_bc4 + 7 < iVar13; local_bc4 = local_bc4 + 8) {
      auVar5 = vcvtdq2ps_avx(*(undefined1 (*) [32])*local_9a8);
      auVar10._8_8_ = uStack_a18;
      auVar10._0_8_ = local_a20;
      auVar10._16_8_ = uStack_a10;
      auVar10._24_8_ = uStack_a08;
      auVar9._8_8_ = uStack_b78;
      auVar9._0_8_ = local_b80;
      auVar9._16_8_ = uStack_b70;
      auVar9._24_8_ = uStack_b68;
      auVar6 = vfmadd213ps_fma(auVar10,auVar5,auVar9);
      local_c60 = auVar6._0_8_;
      uStack_c58 = auVar6._8_8_;
      *(undefined8 *)local_9b0 = local_c60;
      *(undefined8 *)(local_9b0 + 2) = uStack_c58;
      local_9b0[4] = 0.0;
      local_9b0[5] = 0.0;
      local_9b0[6] = 0.0;
      local_9b0[7] = 0.0;
      local_9a8 = (undefined1 (*) [64])(*local_9a8 + 0x20);
      local_9b0 = local_9b0 + 8;
    }
    for (; local_bc4 + 3 < iVar13; local_bc4 = local_bc4 + 4) {
      auVar6 = vcvtdq2ps_avx(*(undefined1 (*) [16])*local_9a8);
      auVar11._8_8_ = uStack_9e8;
      auVar11._0_8_ = local_9f0;
      auVar7._8_8_ = uStack_b48;
      auVar7._0_8_ = local_b50;
      auVar6 = vfmadd213ps_fma(auVar11,auVar6,auVar7);
      local_c70 = auVar6._0_8_;
      uStack_c68 = auVar6._8_8_;
      *(undefined8 *)local_9b0 = local_c70;
      *(undefined8 *)(local_9b0 + 2) = uStack_c68;
      local_9a8 = (undefined1 (*) [64])(*local_9a8 + 0x10);
      local_9b0 = local_9b0 + 4;
    }
    for (; local_bc4 < iVar13; local_bc4 = local_bc4 + 1) {
      *local_9b0 = (float)*(int *)*local_9a8 * fVar1 + fVar2;
      local_9a8 = (undefined1 (*) [64])(*local_9a8 + 4);
      local_9b0 = local_9b0 + 1;
    }
  }
  return;
}

Assistant:

static void dequantize(const int* intptr, float* ptr, const Mat& scale_data, const Mat& bias_data, int elemcount, int elempack)
{
    const int scale_data_size = scale_data.w;
    const int bias_data_size = bias_data.w;
    const int size = elemcount * elempack;

    // NCNN_LOGE("dequantize %d %d   %d %d", scale_data_size, bias_data_size, elemcount, elempack);

    float scale = scale_data[0];
#if __SSE2__
    __m128 _scale = _mm_set1_ps(scale);
#if __AVX__
    __m256 _scale_avx = _mm256_set1_ps(scale);
#if __AVX512F__
    __m512 _scale_avx512 = _mm512_set1_ps(scale);
#endif // __AVX512F__
#endif // __AVX__
    if (scale_data_size > 1)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            _scale_avx512 = _mm512_loadu_ps((const float*)scale_data);
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            _scale_avx = _mm256_loadu_ps((const float*)scale_data);
#if __AVX512F__
            _scale_avx512 = combine8x2_ps(_scale_avx, _scale_avx);
#endif // __AVX512F__
        }
#endif // __AVX__
        if (elempack == 4)
        {
            _scale = _mm_loadu_ps((const float*)scale_data);
#if __AVX__
            _scale_avx = combine4x2_ps(_scale, _scale);
#if __AVX512F__
            _scale_avx512 = combine8x2_ps(_scale_avx, _scale_avx);
#endif // __AVX512F__
#endif // __AVX__
        }
    }
#endif // __SSE2__

    if (bias_data_size == 0)
    {
        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _v = _mm512_cvtepi32_ps(_mm512_loadu_si512((const __m512i*)intptr));
            _v = _mm512_mul_ps(_v, _scale_avx512);
            _mm512_storeu_ps(ptr, _v);
            intptr += 16;
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _v = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)intptr));
            _v = _mm256_mul_ps(_v, _scale_avx);
            _mm256_storeu_ps(ptr, _v);
            intptr += 8;
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _v = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)intptr));
            _v = _mm_mul_ps(_v, _scale);
            _mm_storeu_ps(ptr, _v);
            intptr += 4;
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *intptr * scale;
            intptr++;
            ptr++;
        }
    }
    else
    {
        float bias = bias_data[0];
#if __SSE2__
        __m128 _bias = _mm_set1_ps(bias);
#if __AVX__
        __m256 _bias_avx = _mm256_set1_ps(bias);
#if __AVX512F__
        __m512 _bias_avx512 = _mm512_set1_ps(bias);
#endif // __AVX512F__
#endif // __AVX__
        if (bias_data_size > 1)
        {
#if __AVX__
#if __AVX512F__
            if (elempack == 16)
            {
                _bias_avx512 = _mm512_loadu_ps((const float*)bias_data);
            }
#endif // __AVX512F__
            if (elempack == 8)
            {
                _bias_avx = _mm256_loadu_ps((const float*)bias_data);
#if __AVX512F__
                _bias_avx512 = combine8x2_ps(_bias_avx, _bias_avx);
#endif // __AVX512F__
            }
#endif // __AVX__
            if (elempack == 4)
            {
                _bias = _mm_loadu_ps((const float*)bias_data);
#if __AVX__
                _bias_avx = combine4x2_ps(_bias, _bias);
#if __AVX512F__
                _bias_avx512 = combine8x2_ps(_bias_avx, _bias_avx);
#endif // __AVX512F__
#endif // __AVX__
            }
        }
#endif // __SSE2__

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _v = _mm512_cvtepi32_ps(_mm512_loadu_si512((const __m512i*)intptr));
            _v = _mm512_fmadd_ps(_v, _scale_avx512, _bias_avx512);
            _mm512_storeu_ps(ptr, _v);
            intptr += 16;
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _v = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)intptr));
            _v = _mm256_comp_fmadd_ps(_v, _scale_avx, _bias_avx);
            _mm256_storeu_ps(ptr, _v);
            intptr += 8;
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _v = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)intptr));
            _v = _mm_comp_fmadd_ps(_v, _scale, _bias);
            _mm_storeu_ps(ptr, _v);
            intptr += 4;
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *intptr * scale + bias;
            intptr++;
            ptr++;
        }
    }
}